

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O2

void duckdb::PopulateChunk
               (DataChunk *group_chunk,DataChunk *input_chunk,vector<unsigned_long,_true> *idx_set,
               bool reference)

{
  size_type *psVar1;
  reference this;
  reference other;
  unsigned_long *group_idx;
  size_type *psVar2;
  size_type __n;
  size_type __n_00;
  
  psVar1 = (idx_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n_00 = 0;
  for (psVar2 = (idx_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    if (reference) {
      this = vector<duckdb::Vector,_true>::get<true>(&group_chunk->data,__n_00);
      __n = *psVar2;
    }
    else {
      this = vector<duckdb::Vector,_true>::get<true>(&group_chunk->data,*psVar2);
      __n = __n_00;
    }
    other = vector<duckdb::Vector,_true>::get<true>(&input_chunk->data,__n);
    Vector::Reference(this,other);
    __n_00 = __n_00 + 1;
  }
  group_chunk->count = input_chunk->count;
  return;
}

Assistant:

void PopulateChunk(DataChunk &group_chunk, DataChunk &input_chunk, const vector<idx_t> &idx_set, bool reference) {
	idx_t chunk_index = 0;
	// Populate the group_chunk
	for (auto &group_idx : idx_set) {
		if (reference) {
			// Reference from input_chunk[chunk_index] -> group_chunk[group_idx]
			group_chunk.data[chunk_index++].Reference(input_chunk.data[group_idx]);
		} else {
			// Reference from input_chunk[group.index] -> group_chunk[chunk_index]
			group_chunk.data[group_idx].Reference(input_chunk.data[chunk_index++]);
		}
	}
	group_chunk.SetCardinality(input_chunk.size());
}